

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint __thiscall llvm::dwarf::getVirtuality(dwarf *this,StringRef VirtualityString)

{
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringLiteral S;
  StringLiteral S_00;
  StringLiteral S_01;
  StringSwitch<unsigned_int,_unsigned_int> local_20;
  
  local_20.Str.Length = (size_t)VirtualityString.Data;
  local_20.Result.Storage.field_0.empty = '\0';
  local_20.Result.Storage.hasVal = false;
  S.super_StringRef.Length = 0x12;
  S.super_StringRef.Data = "DW_VIRTUALITY_none";
  local_20.Str.Data = (char *)this;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_20,S,0);
  S_00.super_StringRef.Length = 0x15;
  S_00.super_StringRef.Data = "DW_VIRTUALITY_virtual";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_00,1);
  S_01.super_StringRef.Length = 0x1a;
  S_01.super_StringRef.Data = "DW_VIRTUALITY_pure_virtual";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_01,2);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0xffffffff);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getVirtuality(StringRef VirtualityString) {
  return StringSwitch<unsigned>(VirtualityString)
#define HANDLE_DW_VIRTUALITY(ID, NAME)                                         \
  .Case("DW_VIRTUALITY_" #NAME, DW_VIRTUALITY_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(DW_VIRTUALITY_invalid);
}